

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpu_api_test.c
# Opt level: O0

RK_S32 vpu_encode_demo(VpuApiDemoCmdContext_t *cmd)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  undefined8 uVar4;
  long lVar5;
  RK_S32 RVar6;
  uint uVar7;
  ulong uVar8;
  void *pvVar9;
  long lVar10;
  char *pcVar11;
  undefined4 local_bc;
  uint local_b8;
  int Format;
  RK_U32 h_align;
  RK_U32 w_align;
  RK_S64 fakeTimeUs;
  EncParameter_t *enc_param;
  EncInputStream_t *enc_in;
  VpuApiEncInput *api_enc_in;
  VpuApiEncInput enc_in_strm;
  EncoderOut_t *enc_out;
  EncoderOut_t enc_out_yuv;
  RK_U32 readOneFrameSize;
  RK_S32 size;
  RK_S32 ret;
  RK_S32 fileSize;
  RK_S32 nal;
  FILE *pOutFile;
  FILE *pInFile;
  VpuApiDemoCmdContext_t *cmd_local;
  
  pOutFile = (FILE *)0x0;
  _fileSize = (FILE *)0x0;
  enc_out_yuv._28_4_ = 0;
  enc_in_strm.capability = 0;
  enc_in_strm._36_4_ = 0;
  enc_in = (EncInputStream_t *)&api_enc_in;
  enc_param = (EncParameter_t *)0x0;
  fakeTimeUs = 0;
  _h_align = 0;
  Format = 0;
  local_b8 = 0;
  local_bc = 0;
  if (cmd == (VpuApiDemoCmdContext_t *)0x0) {
    return -1;
  }
  if ((((cmd->have_input == '\0') || (cmd->width == 0)) || (cmd->height == 0)) ||
     (cmd->coding < OMX_RK_VIDEO_CodingMPEG2)) {
    printf("Warning: missing needed parameters for vpu api demo\n");
  }
  if (cmd->have_input == '\0') {
    printf("please set input bitstream file\n");
    readOneFrameSize = 0xffffff9b;
  }
  else {
    pcVar11 = "encode";
    if (cmd->codec_type == CODEC_DECODER) {
      pcVar11 = "decode";
    }
    printf("input bitstream w: %d, h: %d, coding: %d(%s), path: %s\n",(ulong)cmd->width,
           (ulong)cmd->height,(ulong)cmd->coding,pcVar11,cmd->input_file);
    pOutFile = (FILE *)fopen(cmd->input_file,"rb");
    if ((FILE *)pOutFile == (FILE *)0x0) {
      printf("input file not exsist\n");
      readOneFrameSize = 0xffffff9b;
    }
    else {
      if (cmd->have_output != '\0') {
        printf("vpu api demo output file: %s\n",cmd->output_file);
        _fileSize = fopen(cmd->output_file,"wb");
        if (_fileSize == (FILE *)0x0) {
          printf("can not write output file\n");
          readOneFrameSize = 0xffffff9b;
          goto LAB_00102be4;
        }
      }
      ctx = (VpuCodecContext_t *)malloc(0xe0);
      if (ctx == (VpuCodecContext_t *)0x0) {
        printf("Input context has not been properly allocated");
        return -1;
      }
      memset(ctx,0,0xe0);
      ctx->videoCoding = OMX_RK_VIDEO_CodingAVC;
      ctx->codecType = CODEC_ENCODER;
      ctx->width = cmd->width;
      ctx->height = cmd->height;
      fseek((FILE *)pOutFile,0,2);
      uVar8 = ftell((FILE *)pOutFile);
      fseek((FILE *)pOutFile,0,0);
      memset(&api_enc_in,0,0x28);
      enc_param = (EncParameter_t *)&api_enc_in;
      api_enc_in = (VpuApiEncInput *)0x0;
      memset(&enc_out,0,0x20);
      enc_in_strm._32_8_ = &enc_out;
      pvVar9 = malloc((ulong)(cmd->width * cmd->height));
      *(void **)enc_in_strm._32_8_ = pvVar9;
      if (*(long *)enc_in_strm._32_8_ == 0) {
        readOneFrameSize = 0xffffff98;
      }
      else {
        RVar6 = (*vpuapi_open_ctx)(&ctx);
        if ((RVar6 == 0) && (ctx != (VpuCodecContext_t *)0x0)) {
          ctx->codecType = cmd->codec_type;
          ctx->videoCoding = cmd->coding;
          ctx->width = cmd->width;
          ctx->height = cmd->height;
          ctx->no_thread = 1;
          pvVar9 = malloc(0x40);
          ctx->private_data = pvVar9;
          memset(ctx->private_data,0,0x40);
          fakeTimeUs = (RK_S64)ctx->private_data;
          *(RK_U32 *)fakeTimeUs = cmd->width;
          *(RK_U32 *)(fakeTimeUs + 4) = cmd->height;
          *(RK_U32 *)(fakeTimeUs + 0x20) = 0;
          *(RK_U32 *)(fakeTimeUs + 8) = 0;
          *(RK_U32 *)(fakeTimeUs + 0xc) = 4000000;
          *(RK_U32 *)(fakeTimeUs + 0x10) = 0x19;
          *(RK_U32 *)(fakeTimeUs + 0x18) = 1;
          *(RK_U32 *)(fakeTimeUs + 0x1c) = 0;
          *(RK_U32 *)(fakeTimeUs + 0x24) = 0x1e;
          *(RK_U32 *)(fakeTimeUs + 0x2c) = 100;
          *(RK_U32 *)(fakeTimeUs + 0x30) = 0x28;
          uVar7 = (*ctx->init)(ctx,(RK_U8 *)0x0,0);
          if (uVar7 == 0) {
            printf("encode init ok, sps len: %d\n",(ulong)(uint)ctx->extradata_size);
            if ((_fileSize != (FILE *)0x0) && (0 < ctx->extradata_size)) {
              printf("dump %d bytes enc output stream to file\n",(ulong)(uint)ctx->extradata_size);
              fwrite(ctx->extradata,1,(long)ctx->extradata_size,_fileSize);
              fflush(_fileSize);
            }
            uVar7 = (*ctx->control)(ctx,VPU_API_ENC_SETFORMAT,&local_bc);
            if (uVar7 != 0) {
              printf("VPU_API_ENC_SETFORMAT ret %d\n",(ulong)uVar7);
            }
            uVar7 = (*ctx->control)(ctx,VPU_API_ENC_GETCFG,(void *)fakeTimeUs);
            if (uVar7 != 0) {
              printf("VPU_API_ENC_GETCFG ret %d\n",(ulong)uVar7);
            }
            *(undefined4 *)(fakeTimeUs + 8) = 1;
            readOneFrameSize = (*ctx->control)(ctx,VPU_API_ENC_SETCFG,(void *)fakeTimeUs);
            if (readOneFrameSize != 0) {
              printf("VPU_API_ENC_SETCFG ret %d\n",(ulong)readOneFrameSize);
            }
            printf("init vpu api context ok, input yuv stream file size: %d\n",uVar8 & 0xffffffff);
            Format = ctx->width + 0xf & 0xfffffff0;
            local_b8 = ctx->height + 0xf & 0xfffffff0;
            uVar7 = Format * local_b8 * 3 >> 1;
            enc_out_yuv._28_4_ = ctx->width * ctx->height * 3 >> 1;
            printf("%d %d %d %d %d",(ulong)ctx->width,(ulong)ctx->height,(ulong)(uint)Format,
                   (ulong)local_b8,(ulong)uVar7);
            while (lVar10 = ftell((FILE *)pOutFile), lVar10 < (int)uVar8) {
              if ((enc_param != (EncParameter_t *)0x0) && (enc_param->rc_mode == 0)) {
                lVar10._0_4_ = enc_param->width;
                lVar10._4_4_ = enc_param->height;
                if (lVar10 == 0) {
                  pvVar9 = malloc((long)(int)uVar7);
                  *(void **)enc_param = pvVar9;
                  lVar2._0_4_ = enc_param->width;
                  lVar2._4_4_ = enc_param->height;
                  if (lVar2 == 0) {
                    readOneFrameSize = 0xffffff98;
                    goto LAB_00102be4;
                  }
                  *(uint *)&enc_in[1].buf = uVar7;
                }
                if (*(uint *)&enc_in[1].buf < uVar7) {
                  pvVar9 = realloc(*(void **)enc_param,(long)(int)uVar7);
                  *(void **)enc_param = pvVar9;
                  lVar3._0_4_ = enc_param->width;
                  lVar3._4_4_ = enc_param->height;
                  if (lVar3 == 0) {
                    readOneFrameSize = 0xffffff98;
                    goto LAB_00102be4;
                  }
                  *(uint *)&enc_in[1].buf = uVar7;
                }
                RVar6 = readBytesFromFile(*(RK_U8 **)enc_param,enc_out_yuv._28_4_,pOutFile);
                if (RVar6 != 0) goto LAB_00102be4;
                enc_param->rc_mode = uVar7;
                enc_param->framerate = h_align;
                enc_param->qp = w_align;
                _h_align = _h_align + 40000;
                uVar1 = enc_param->rc_mode;
                uVar4._0_4_ = enc_param->framerate;
                uVar4._4_4_ = enc_param->qp;
                lVar10 = ftell((FILE *)pOutFile);
                printf("read one frame, size: %d, timeUs: %lld, filePos: %ld\n",(ulong)uVar1,uVar4,
                       lVar10);
              }
              readOneFrameSize =
                   (*ctx->encode)(ctx,(EncInputStream_t *)enc_param,
                                  (EncoderOut_t *)enc_in_strm._32_8_);
              if ((int)readOneFrameSize < 0) {
                readOneFrameSize = 0xffffff42;
                goto LAB_00102be4;
              }
              enc_param->rc_mode = 0;
              printf("vpu encode one frame, out len: %d, left size: %d\n",
                     (ulong)*(uint *)(enc_in_strm._32_8_ + 8),(ulong)(uint)enc_param->rc_mode);
              if ((*(int *)(enc_in_strm._32_8_ + 8) != 0) && (*(long *)enc_in_strm._32_8_ != 0)) {
                if (_fileSize != (FILE *)0x0) {
                  printf("dump %d bytes enc output stream to file\n",
                         (ulong)*(uint *)(enc_in_strm._32_8_ + 8));
                  fwrite(*(void **)enc_in_strm._32_8_,1,(long)*(int *)(enc_in_strm._32_8_ + 8),
                         _fileSize);
                  fflush(_fileSize);
                }
                *(undefined4 *)(enc_in_strm._32_8_ + 8) = 0;
              }
              usleep(3000);
            }
            printf("read end of file, complete\n");
          }
          else {
            printf("init vpu api context fail, ret: 0x%X\n",(ulong)uVar7);
            readOneFrameSize = 0xffffff97;
          }
        }
        else {
          readOneFrameSize = 0xffffff98;
        }
      }
    }
  }
LAB_00102be4:
  if ((enc_param != (EncParameter_t *)0x0) &&
     (lVar5._0_4_ = enc_param->width, lVar5._4_4_ = enc_param->height, lVar5 != 0)) {
    free(*(void **)enc_param);
    enc_param->width = 0;
    enc_param->height = 0;
  }
  if ((enc_in_strm._32_8_ != 0) && (*(long *)enc_in_strm._32_8_ != 0)) {
    free(*(void **)enc_in_strm._32_8_);
    *(undefined8 *)enc_in_strm._32_8_ = 0;
  }
  if (ctx != (VpuCodecContext_t *)0x0) {
    if (ctx->private_data != (void *)0x0) {
      free(ctx->private_data);
      ctx->private_data = (void *)0x0;
    }
    (*vpuapi_close_ctx)(&ctx);
    ctx = (VpuCodecContext_t *)0x0;
  }
  if (pOutFile != (FILE *)0x0) {
    fclose((FILE *)pOutFile);
  }
  if (_fileSize != (FILE *)0x0) {
    fclose(_fileSize);
  }
  if (readOneFrameSize == 0) {
    printf("encode demo complete OK.\n");
  }
  else {
    printf("encode demo fail, err: %d\n",(ulong)readOneFrameSize);
  }
  return readOneFrameSize;
}

Assistant:

static RK_S32 vpu_encode_demo(VpuApiDemoCmdContext_t *cmd)
{
    FILE *pInFile = NULL;
    FILE *pOutFile = NULL;
    RK_S32 nal = 0x00000001;
    RK_S32 fileSize;
    RK_S32 ret = 0;
    RK_S32 size;
    RK_U32 readOneFrameSize = 0;
    EncoderOut_t    enc_out_yuv;
    EncoderOut_t *enc_out = NULL;
    VpuApiEncInput enc_in_strm;
    VpuApiEncInput *api_enc_in = &enc_in_strm;
    EncInputStream_t *enc_in = NULL;
    EncParameter_t *enc_param = NULL;
    RK_S64 fakeTimeUs = 0;
    RK_U32 w_align = 0;
    RK_U32 h_align = 0;

    int Format = ENC_INPUT_YUV420_PLANAR;

    if (cmd == NULL) {
        return -1;
    }

    if ((cmd->have_input == 0) || (cmd->width <= 0) || (cmd->height <= 0)
        || (cmd->coding <= OMX_RK_VIDEO_CodingAutoDetect)) {
        printf("Warning: missing needed parameters for vpu api demo\n");
    }

    if (cmd->have_input) {
        printf("input bitstream w: %d, h: %d, coding: %d(%s), path: %s\n",
               cmd->width, cmd->height, cmd->coding,
               cmd->codec_type == CODEC_DECODER ? "decode" : "encode",
               cmd->input_file);

        pInFile = fopen(cmd->input_file, "rb");
        if (pInFile == NULL) {
            printf("input file not exsist\n");
            ENCODE_ERR_RET(ERROR_INVALID_PARAM);
        }
    } else {
        printf("please set input bitstream file\n");
        ENCODE_ERR_RET(ERROR_INVALID_PARAM);
    }

    if (cmd->have_output) {
        printf("vpu api demo output file: %s\n",
               cmd->output_file);
        pOutFile = fopen(cmd->output_file, "wb");
        if (pOutFile == NULL) {
            printf("can not write output file\n");
            ENCODE_ERR_RET(ERROR_INVALID_PARAM);
        }
    }

#ifdef FOR_TEST_ENCODE
    ctx = (struct VpuCodecContext *)malloc(sizeof(struct VpuCodecContext));
    if (!ctx) {
        printf("Input context has not been properly allocated");
        return -1;
    }
    memset(ctx, 0, sizeof(struct VpuCodecContext));

    ctx->videoCoding = OMX_RK_VIDEO_CodingAVC;
    ctx->codecType = CODEC_ENCODER;
    ctx->width  = cmd->width;
    ctx->height = cmd->height;
#endif

    fseek(pInFile, 0L, SEEK_END);
    fileSize = ftell(pInFile);
    fseek(pInFile, 0L, SEEK_SET);

    memset(&enc_in_strm, 0, sizeof(VpuApiEncInput));
    enc_in = &enc_in_strm.stream;
    enc_in->buf = NULL;

    memset(&enc_out_yuv, 0, sizeof(EncoderOut_t));
    enc_out = &enc_out_yuv;
    enc_out->data = (RK_U8 *)malloc(cmd->width * cmd->height);
    if (enc_out->data == NULL) {
        ENCODE_ERR_RET(ERROR_MEMORY);
    }

    ret = vpuapi_open_ctx(&ctx);
    if (ret || (ctx == NULL)) {
        ENCODE_ERR_RET(ERROR_MEMORY);
    }

    /*
     ** now init vpu api context. codecType, codingType, width ,height
     ** are all needed before init.
    */
    ctx->codecType = cmd->codec_type;
    ctx->videoCoding = cmd->coding;
    ctx->width = cmd->width;
    ctx->height = cmd->height;
    ctx->no_thread = 1;

    ctx->private_data = malloc(sizeof(EncParameter_t));
    memset(ctx->private_data, 0, sizeof(EncParameter_t));

    enc_param = (EncParameter_t *)ctx->private_data;
    enc_param->width        = cmd->width;
    enc_param->height       = cmd->height;
    enc_param->format       = ENC_INPUT_YUV420_PLANAR;
    enc_param->rc_mode      = 0;
    enc_param->bitRate      = 4000000;
    enc_param->framerate    = 25;
    enc_param->enableCabac  = 1;
    enc_param->cabacInitIdc = 0;
    enc_param->intraPicRate = 30;
    enc_param->profileIdc   = 100;
    enc_param->levelIdc     = 40;

    if ((ret = ctx->init(ctx, NULL, 0)) != 0) {
        printf("init vpu api context fail, ret: 0x%X\n", ret);
        ENCODE_ERR_RET(ERROR_INIT_VPU);
    }

    /*
     ** init of VpuCodecContext while running encode, it returns
     ** sps and pps of encoder output, you need to save sps and pps
     ** after init.
    */
    printf("encode init ok, sps len: %d\n", ctx->extradata_size);
    if (pOutFile && (ctx->extradata_size > 0)) {
        printf("dump %d bytes enc output stream to file\n",
               ctx->extradata_size);

        /* save sps and pps */
        fwrite(ctx->extradata, 1, ctx->extradata_size, pOutFile);
        fflush(pOutFile);
    }

    ret = ctx->control(ctx, VPU_API_ENC_SETFORMAT, &Format);
    if (ret)
        printf("VPU_API_ENC_SETFORMAT ret %d\n", ret);

    ret = ctx->control(ctx, VPU_API_ENC_GETCFG, enc_param);
    if (ret)
        printf("VPU_API_ENC_GETCFG ret %d\n", ret);

    enc_param->rc_mode = 1;

    ret = ctx->control(ctx, VPU_API_ENC_SETCFG, enc_param);
    if (ret)
        printf("VPU_API_ENC_SETCFG ret %d\n", ret);

    /*
     ** vpu api encode process.
    */
    printf("init vpu api context ok, input yuv stream file size: %d\n", fileSize);
    w_align = ((ctx->width + 15) & (~15));
    h_align = ((ctx->height + 15) & (~15));
    size = w_align * h_align * 3 / 2;
    readOneFrameSize = ctx->width * ctx->height * 3 / 2;
    printf("%d %d %d %d %d", ctx->width, ctx->height, w_align, h_align, size);
    nal = BSWAP32(nal);

    do {
        if (ftell(pInFile) >= fileSize) {
            printf("read end of file, complete\n");
            break;
        }

        if (enc_in && (enc_in->size == 0)) {
            if (enc_in->buf == NULL) {
                enc_in->buf = (RK_U8 *)(malloc)(size);
                if (enc_in->buf == NULL) {
                    ENCODE_ERR_RET(ERROR_MEMORY);
                }
                api_enc_in->capability = size;
            }

            if (api_enc_in->capability < ((RK_U32)size)) {
                enc_in->buf = (RK_U8 *)(realloc)((void *)(enc_in->buf), size);
                if (enc_in->buf == NULL) {
                    ENCODE_ERR_RET(ERROR_MEMORY);
                }
                api_enc_in->capability = size;
            }

            if (readBytesFromFile(enc_in->buf, readOneFrameSize, pInFile)) {
                break;
            } else {
                enc_in->size = size;
                enc_in->timeUs = fakeTimeUs;
                fakeTimeUs += 40000;
            }

            printf("read one frame, size: %d, timeUs: %lld, filePos: %ld\n",
                   enc_in->size, enc_in->timeUs, ftell(pInFile));
        }

        if ((ret = ctx->encode(ctx, enc_in, enc_out)) < 0) {
            ENCODE_ERR_RET(ERROR_VPU_DECODE);
        } else {
            enc_in->size = 0;  // TODO encode completely, and set enc_in->size to 0
            printf("vpu encode one frame, out len: %d, left size: %d\n",
                   enc_out->size, enc_in->size);

            /*
             ** encoder output stream is raw bitstream, you need to add nal
             ** head by yourself.
            */
            if ((enc_out->size) && (enc_out->data)) {
                if (pOutFile) {
                    printf("dump %d bytes enc output stream to file\n",
                           enc_out->size);
                    //fwrite((RK_U8*)&nal, 1, 4, pOutFile);  // because output stream have start code, so here mask this code
                    fwrite(enc_out->data, 1, enc_out->size, pOutFile);
                    fflush(pOutFile);
                }

                enc_out->size = 0;
            }
        }

        usleep(3000);
    } while (1);

ENCODE_OUT:
    if (enc_in && enc_in->buf) {
        free(enc_in->buf);
        enc_in->buf = NULL;
    }
    if (enc_out && (enc_out->data)) {
        free(enc_out->data);
        enc_out->data = NULL;
    }
    if (ctx) {
        if (ctx->private_data) {
            free(ctx->private_data);
            ctx->private_data = NULL;
        }
        vpuapi_close_ctx(&ctx);
        ctx = NULL;
    }
    if (pInFile) {
        fclose(pInFile);
        pInFile = NULL;
    }
    if (pOutFile) {
        fclose(pOutFile);
        pOutFile = NULL;
    }

    if (ret) {
        printf("encode demo fail, err: %d\n", ret);
    } else {
        printf("encode demo complete OK.\n");
    }
    return ret;

}